

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

void __thiscall
entityx::ComponentHelper<A>::copy_component_to(ComponentHelper<A> *this,Entity source,Entity target)

{
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  Entity::component<A,void>(in_stack_ffffffffffffffb8._8_8_);
  ComponentHandle<A,_entityx::EntityManager>::get(in_stack_ffffffffffffffb8._8_8_);
  Entity::assign_from_copy<A>(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }